

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

string * __thiscall
lest::to_string<bool,bool>(string *__return_storage_ptr__,lest *this,bool *lhs,string *op,bool *rhs)

{
  ostream *poVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  ostringstream os;
  size_type *local_208;
  size_type local_200;
  size_type local_1f8;
  undefined8 uStack_1f0;
  size_type *local_1e8;
  size_type local_1e0;
  size_type local_1d8;
  undefined8 uStack_1d0;
  size_type *local_1c8;
  size_type local_1c0;
  size_type local_1b8;
  undefined8 uStack_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pcVar4 = "false";
  pcVar3 = "false";
  if ((ulong)(byte)*this != 0) {
    pcVar3 = "true";
  }
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,pcVar3,pcVar3 + ((ulong)(byte)*this ^ 5));
  local_1e8 = local_208;
  if (local_208 == &local_1f8) {
    uStack_1d0 = uStack_1f0;
    local_1e8 = &local_1d8;
  }
  local_1e0 = local_200;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_1e8,local_200);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,*(char **)lhs,*(long *)(lhs + 8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  uVar2 = (ulong)*(byte *)&(op->_M_dataplus)._M_p;
  if (uVar2 != 0) {
    pcVar4 = "true";
  }
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,pcVar4,pcVar4 + (uVar2 ^ 5));
  local_1c8 = local_208;
  if (local_208 == &local_1f8) {
    uStack_1b0 = uStack_1f0;
    local_1c8 = &local_1b8;
  }
  local_1c0 = local_200;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_1c8,local_200);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8);
  }
  std::__cxx11::stringbuf::str();
  if (local_208 == &local_1f8) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_1f8;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_1f0;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_208;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_1f8;
  }
  __return_storage_ptr__->_M_string_length = local_200;
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( L const & lhs, std::string op, R const & rhs ) -> std::string
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}